

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_Symbol_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue v_00;
  JSValue val_02;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSValue this_obj;
  JSValue val_08;
  JSValue this_obj_00;
  JSValue val_09;
  JSValue obj;
  JSValue val_10;
  JSValue val_11;
  JSValue val_12;
  JSValue val_13;
  JSValue val_14;
  JSValue val_15;
  JSValue val_16;
  JSValue v_13;
  JSValue rx_00;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue this_obj_04;
  JSValue this_obj_05;
  JSValue s;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue r;
  JSValue this_val_00;
  JSValue val_17;
  JSValue arg;
  JSValue this_val_01;
  JSValue this_val_02;
  JSValue this_obj_06;
  JSValue this_obj_07;
  JSValue this_obj_08;
  JSValue this_obj_09;
  JSValue this_obj_10;
  JSValue obj_03;
  JSValue obj_04;
  JSValue obj_05;
  JSValue obj_06;
  JSValue obj_07;
  JSValue v_14;
  JSValue v_15;
  JSValue v_16;
  JSValue v_17;
  JSValue v_18;
  JSValue v_19;
  JSValue v_20;
  JSValue val_18;
  int iVar3;
  int iVar4;
  int iVar5;
  BOOL BVar6;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  long in_R8;
  JSValue JVar7;
  JSValue namedCaptures1;
  JSValue capN;
  JSValue result_1;
  int64_t nextIndex;
  int64_t thisIndex;
  JSValue result;
  int64_t position;
  uint32_t nCaptures;
  int fullUnicode;
  int is_global;
  int functionalReplace;
  int j;
  int n;
  int nextSourcePosition;
  ValueBuffer *results;
  ValueBuffer v_b;
  StringBuffer *b;
  StringBuffer b_s;
  JSString *rp;
  JSString *sp;
  JSValue res;
  JSValue namedCaptures;
  JSValue rep_str;
  JSValue tab;
  JSValue matched;
  JSValue rep_val;
  JSValue str;
  JSValue args [6];
  JSValue rep;
  JSValue rx;
  JSValue v;
  undefined4 in_stack_fffffffffffff948;
  uint32_t to;
  uint32_t in_stack_fffffffffffff94c;
  JSContext *in_stack_fffffffffffff950;
  JSValueUnion in_stack_fffffffffffff958;
  JSValueUnion in_stack_fffffffffffff960;
  JSValueUnion in_stack_fffffffffffff968;
  JSValueUnion in_stack_fffffffffffff970;
  JSValueUnion in_stack_fffffffffffff978;
  JSValueUnion in_stack_fffffffffffff980;
  JSValueUnion in_stack_fffffffffffff988;
  JSContext *in_stack_fffffffffffff990;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffff998;
  JSValueUnion in_stack_fffffffffffff9a0;
  int32_t in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  JSValueUnion in_stack_fffffffffffff9b0;
  JSValueUnion JVar8;
  undefined4 in_stack_fffffffffffff9c0;
  uint in_stack_fffffffffffff9c4;
  JSValueUnion in_stack_fffffffffffff9c8;
  int64_t in_stack_fffffffffffff9d0;
  int64_t local_628;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  JSValueUnion in_stack_fffffffffffff9e8;
  JSValueUnion in_stack_fffffffffffff9f0;
  int64_t local_608;
  undefined8 in_stack_fffffffffffffa00;
  uint uStack_5ec;
  JSValueUnion local_5e0;
  int64_t local_5d8;
  JSContext *in_stack_fffffffffffffa30;
  JSValueUnion in_stack_fffffffffffffa38;
  int64_t in_stack_fffffffffffffa40;
  JSValueUnion in_stack_fffffffffffffa48;
  int64_t in_stack_fffffffffffffa50;
  int64_t local_5a8;
  undefined4 in_stack_fffffffffffffa60;
  uint in_stack_fffffffffffffa64;
  undefined8 in_stack_fffffffffffffa68;
  JSValueUnion in_stack_fffffffffffffa70;
  JSValueUnion in_stack_fffffffffffffa78;
  JSValueUnion in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa98;
  JSValueUnion in_stack_fffffffffffffaa0;
  JSValueUnion in_stack_fffffffffffffaa8;
  JSValueUnion in_stack_fffffffffffffab0;
  JSValueUnion in_stack_fffffffffffffab8;
  JSValueUnion in_stack_fffffffffffffac0;
  JSValueUnion local_510;
  int64_t local_508;
  JSValueUnion local_4e0;
  int64_t local_4d8;
  JSValueUnion in_stack_fffffffffffffb40;
  JSValueUnion local_480;
  int64_t local_478;
  JSValueUnion local_450;
  int64_t local_448;
  JSValueUnion local_410;
  int64_t local_408;
  JSValueUnion local_400;
  int64_t local_3f8;
  uint uStack_3ec;
  uint uStack_3dc;
  uint uStack_3cc;
  uint uStack_3bc;
  uint uStack_3ac;
  ulong local_3a0;
  uint local_394;
  int local_384;
  uint local_380;
  int local_37c;
  ValueBuffer local_370;
  undefined1 *local_310;
  undefined1 local_308 [32];
  JSValueUnion local_2e8;
  JSValueUnion local_2e0;
  JSValueUnion local_2d8;
  int64_t local_2d0;
  JSValueUnion local_2c8;
  JSValueUnion local_2c0;
  JSValueUnion local_2b8;
  int64_t local_2b0;
  JSValueUnion local_2a8;
  int64_t local_2a0;
  JSValueUnion local_298;
  int64_t iStack_290;
  JSValueUnion local_288;
  int64_t local_280;
  JSValueUnion local_278;
  int64_t iStack_270;
  JSValueUnion local_268;
  int64_t iStack_260;
  JSValueUnion local_258;
  int64_t iStack_250;
  undefined8 local_248;
  undefined8 local_240;
  JSValueUnion local_238;
  int64_t local_230;
  JSValueUnion local_228;
  int64_t local_220;
  JSValueUnion local_218;
  int64_t local_210;
  JSValueUnion local_208;
  int64_t local_200;
  JSValueUnion local_1f8;
  int64_t local_1f0;
  JSValueUnion local_1d8;
  JSValueUnion local_1c0;
  int64_t local_1b8;
  undefined4 local_1ac;
  JSValueUnion local_1a8;
  JSValueUnion local_1a0;
  int64_t local_198;
  JSValueUnion local_190;
  JSValueUnion local_188;
  undefined4 local_17c;
  JSValueUnion local_178;
  JSValueUnion local_170;
  int64_t local_168;
  JSValue local_160;
  undefined4 local_14c;
  JSValueUnion local_148;
  JSValueUnion local_140;
  int64_t local_138;
  JSValue local_130;
  undefined4 local_11c;
  JSValueUnion local_118;
  JSValueUnion local_110;
  int64_t local_108;
  JSValue local_100;
  undefined4 local_ec;
  JSValueUnion local_e8;
  JSValueUnion local_e0;
  int64_t local_d8;
  JSValue local_d0;
  int local_bc;
  JSValueUnion local_b8;
  int local_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  int local_9c;
  JSValueUnion local_98;
  int local_90;
  undefined8 local_88;
  undefined4 local_7c;
  JSValueUnion local_78;
  undefined4 local_70;
  undefined8 local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  undefined8 local_48;
  int64_t local_40;
  JSValueUnion local_38;
  JSValueUnion local_30;
  int64_t local_28;
  int local_1c;
  JSValueUnion local_18;
  int local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_208 = *(JSValueUnion *)(in_R8 + 0x10);
  local_200 = *(int64_t *)(in_R8 + 0x18);
  local_310 = local_308;
  JVar7.tag = in_RDX;
  JVar7.u.float64 = in_RSI.float64;
  local_1f8 = in_RSI;
  local_1f0 = in_RDX;
  local_1d8 = in_RDI;
  iVar3 = JS_IsObject(JVar7);
  if (iVar3 == 0) {
    JVar7 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x171165);
    return JVar7;
  }
  string_buffer_init(in_stack_fffffffffffff950,
                     (StringBuffer *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),0
                    );
  value_buffer_init((JSContext *)local_1d8.ptr,&local_370);
  local_288.ptr = (void *)((ulong)uStack_3ac << 0x20);
  local_280 = 3;
  local_298.ptr = (void *)((ulong)uStack_3bc << 0x20);
  iStack_290 = 3;
  local_2a8.ptr = (void *)((ulong)uStack_3cc << 0x20);
  local_2a0 = 3;
  local_2b8.ptr = (void *)((ulong)uStack_3dc << 0x20);
  local_2b0 = 3;
  local_2c8.ptr = (void *)((ulong)uStack_3ec << 0x20);
  local_2c0.float64 = 1.48219693752374e-323;
  val.u._4_4_ = in_stack_fffffffffffff94c;
  val.u.int32 = in_stack_fffffffffffff948;
  val.tag = (int64_t)in_stack_fffffffffffff950;
  JVar7 = JS_ToString((JSContext *)0x1712d5,val);
  local_400 = JVar7.u;
  local_278 = local_400;
  local_3f8 = JVar7.tag;
  iStack_270 = local_3f8;
  iVar3 = JS_IsException(JVar7);
  if (iVar3 == 0) {
    local_2e0 = local_278;
    local_2e8.float64 = 0.0;
    val_18.tag = local_200;
    val_18.u.float64 = local_208.float64;
    iVar3 = JS_IsFunction((JSContext *)local_1d8.ptr,val_18);
    if (iVar3 == 0) {
      val_00.u._4_4_ = in_stack_fffffffffffff94c;
      val_00.u.int32 = in_stack_fffffffffffff948;
      val_00.tag = (int64_t)in_stack_fffffffffffff950;
      JVar7 = JS_ToString((JSContext *)0x17138b,val_00);
      local_410 = JVar7.u;
      local_288 = local_410;
      local_408 = JVar7.tag;
      local_280 = local_408;
      iVar4 = JS_IsException(JVar7);
      if (iVar4 != 0) goto LAB_00172771;
      local_2e8 = local_288;
    }
    local_e0 = local_1f8;
    local_d8 = local_1f0;
    local_e8.float64 = local_1d8.float64;
    local_ec = 0x6e;
    to = 0;
    obj_03.tag = (int64_t)in_stack_fffffffffffffac0.ptr;
    obj_03.u.ptr = in_stack_fffffffffffffab8.ptr;
    this_obj_06.tag = (int64_t)in_stack_fffffffffffffab0.ptr;
    this_obj_06.u.ptr = in_stack_fffffffffffffaa8.ptr;
    JVar8 = local_1d8;
    local_d0 = JS_GetPropertyInternal
                         ((JSContext *)in_stack_fffffffffffffaa0.ptr,obj_03,
                          (JSAtom)((ulong)in_stack_fffffffffffffa98 >> 0x20),this_obj_06,
                          in_stack_fffffffffffffb40.int32);
    val_15.tag = (int64_t)in_stack_fffffffffffff988.ptr;
    val_15.u.ptr = in_stack_fffffffffffff980.ptr;
    iVar4 = JS_ToBoolFree((JSContext *)in_stack_fffffffffffff978.ptr,val_15);
    if (iVar4 < 0) goto LAB_00172771;
    if (iVar4 != 0) {
      local_110 = local_1f8;
      local_108 = local_1f0;
      local_118.float64 = local_1d8.float64;
      local_11c = 0x6f;
      to = 0;
      obj_04.tag = (int64_t)in_stack_fffffffffffffac0.ptr;
      obj_04.u.ptr = in_stack_fffffffffffffab8.ptr;
      this_obj_07.tag = (int64_t)in_stack_fffffffffffffab0.ptr;
      this_obj_07.u.ptr = in_stack_fffffffffffffaa8.ptr;
      in_stack_fffffffffffff9b0 = local_1d8;
      local_100 = JS_GetPropertyInternal
                            ((JSContext *)in_stack_fffffffffffffaa0.ptr,obj_04,
                             (JSAtom)((ulong)in_stack_fffffffffffffa98 >> 0x20),this_obj_07,
                             in_stack_fffffffffffffb40.int32);
      val_16.tag = (int64_t)in_stack_fffffffffffff988.ptr;
      val_16.u.ptr = in_stack_fffffffffffff980.ptr;
      iVar5 = JS_ToBoolFree((JSContext *)in_stack_fffffffffffff978.ptr,val_16);
      if (-1 < iVar5) {
        local_78 = local_1d8;
        local_7c = 0;
        local_70 = 0;
        local_68 = 0;
        this_obj.tag = (int64_t)in_stack_fffffffffffff970.ptr;
        this_obj.u.float64 = in_stack_fffffffffffff968.float64;
        val_01.tag = (int64_t)in_stack_fffffffffffff960.ptr;
        val_01.u.float64 = in_stack_fffffffffffff958.float64;
        iVar5 = JS_SetProperty(in_stack_fffffffffffff950,this_obj,in_stack_fffffffffffff94c,val_01);
        if (-1 < iVar5) goto LAB_00171634;
      }
      goto LAB_00172771;
    }
LAB_00171634:
    if ((((local_2e8.ptr == (void *)0x0) ||
         ((*(ulong *)((long)local_2e8.ptr + 4) & 0x7fffffff) != 0)) || (iVar4 == 0)) ||
       (rx_00.tag = (int64_t)in_stack_fffffffffffff990, rx_00.u.ptr = in_stack_fffffffffffff988.ptr,
       iVar5 = js_is_standard_regexp((JSContext *)in_stack_fffffffffffff980.ptr,rx_00), iVar5 == 0))
    {
      do {
        do {
          r.u._4_4_ = in_stack_fffffffffffff9ac;
          r.u.int32 = in_stack_fffffffffffff9a8;
          r.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
          s.tag = (int64_t)in_stack_fffffffffffff9a0.ptr;
          s.u.float64 = in_stack_fffffffffffff998.float64;
          JVar7 = JS_RegExpExec(in_stack_fffffffffffff990,r,s);
          iVar5 = JS_IsException(JVar7);
          if (iVar5 != 0) goto LAB_00172771;
          iVar5 = JS_IsNull(JVar7);
          if (iVar5 != 0) {
LAB_00171afe:
            local_37c = 0;
            local_384 = 0;
            goto LAB_00171b14;
          }
          val_03.tag = (int64_t)in_stack_fffffffffffff968.ptr;
          val_03.u.ptr = in_stack_fffffffffffff960.ptr;
          iVar5 = value_buffer_append((ValueBuffer *)in_stack_fffffffffffff958.ptr,val_03);
          if (iVar5 < 0) goto LAB_00172771;
          if (iVar4 == 0) goto LAB_00171afe;
          v_00.tag = (int64_t)in_stack_fffffffffffff960.ptr;
          v_00.u.ptr = in_stack_fffffffffffff958.ptr;
          JS_FreeValue(in_stack_fffffffffffff950,v_00);
          in_stack_fffffffffffff9a8 = local_1d8.int32;
          in_stack_fffffffffffff9ac = local_1d8._4_4_;
          obj_00.tag = (int64_t)in_stack_fffffffffffff9a0.ptr;
          obj_00.u.float64 = in_stack_fffffffffffff998.float64;
          JS_GetPropertyInt64(in_stack_fffffffffffff990,obj_00,(int64_t)in_stack_fffffffffffff988);
          val_04.tag = (int64_t)in_stack_fffffffffffff968.ptr;
          val_04.u.ptr = in_stack_fffffffffffff960.ptr;
          JVar7 = JS_ToStringFree((JSContext *)in_stack_fffffffffffff958.ptr,val_04);
          local_480 = JVar7.u;
          local_298 = local_480;
          local_478 = JVar7.tag;
          iStack_290 = local_478;
          iVar5 = JS_IsException(JVar7);
          if (iVar5 != 0) goto LAB_00172771;
          v_18.tag = iStack_290;
          v_18.u.float64 = local_298.float64;
          BVar6 = JS_IsEmptyString(v_18);
        } while (BVar6 == 0);
        local_140 = local_1f8;
        local_138 = local_1f0;
        local_148 = local_1d8;
        local_14c = 0x55;
        to = 0;
        obj_05.tag = (int64_t)in_stack_fffffffffffffac0.ptr;
        obj_05.u.float64 = in_stack_fffffffffffffab8.float64;
        this_obj_08.tag = (int64_t)in_stack_fffffffffffffab0.ptr;
        this_obj_08.u.float64 = in_stack_fffffffffffffaa8.float64;
        in_stack_fffffffffffff9a0 = local_1d8;
        local_130 = JS_GetPropertyInternal
                              ((JSContext *)in_stack_fffffffffffffaa0.ptr,obj_05,
                               (JSAtom)((ulong)in_stack_fffffffffffffa98 >> 0x20),this_obj_08,
                               in_stack_fffffffffffffb40.int32);
        val_08.tag = (int64_t)in_stack_fffffffffffff970.ptr;
        val_08.u.ptr = in_stack_fffffffffffff968.ptr;
        iVar5 = JS_ToLengthFree((JSContext *)in_stack_fffffffffffff960.ptr,
                                (int64_t *)in_stack_fffffffffffff958.ptr,val_08);
        if (iVar5 < 0) break;
        local_40 = string_advance_index
                             ((JSString *)in_stack_fffffffffffff950,
                              CONCAT44(in_stack_fffffffffffff94c,to),0);
        local_38.float64 = local_1d8.float64;
        iVar5 = (int)local_40;
        in_stack_fffffffffffff998 = local_1d8;
        if (local_40 == iVar5) {
          local_18.float64 = local_1d8.float64;
          local_8 = 0;
          local_50._4_4_ = uStack_c;
          local_50.int32 = iVar5;
          local_48 = 0;
          local_28 = 0;
          local_30 = local_50;
          local_1c = iVar5;
          local_10 = iVar5;
        }
        else {
          _local_60 = __JS_NewFloat64((JSContext *)local_1d8.ptr,(double)local_40);
          local_30 = local_60;
          local_28 = local_58;
        }
        this_obj_00.tag = (int64_t)in_stack_fffffffffffff970.ptr;
        this_obj_00.u.ptr = in_stack_fffffffffffff968.ptr;
        val_02.tag = (int64_t)in_stack_fffffffffffff960.ptr;
        val_02.u.ptr = in_stack_fffffffffffff958.ptr;
        in_stack_fffffffffffffb40 = local_30;
        iVar5 = JS_SetProperty(in_stack_fffffffffffff950,this_obj_00,in_stack_fffffffffffff94c,
                               val_02);
      } while (-1 < iVar5);
      goto LAB_00172771;
    }
    this_val_01.tag = in_stack_fffffffffffffa50;
    this_val_01.u.float64 = in_stack_fffffffffffffa48.float64;
    arg.tag = in_stack_fffffffffffffa40;
    arg.u.float64 = in_stack_fffffffffffffa38.float64;
    JVar7 = JS_RegExpDelete(in_stack_fffffffffffffa30,this_val_01,arg);
    local_450 = JVar7.u;
    local_2d8 = local_450;
    local_448 = JVar7.tag;
    local_2d0 = local_448;
  }
  else {
LAB_00172771:
    local_2d8.ptr = (void *)((ulong)in_stack_fffffffffffff9c4 << 0x20);
    local_2d0 = 6;
  }
  string_buffer_free((StringBuffer *)0x1727af);
LAB_001727af:
  value_buffer_free((ValueBuffer *)0x1727bc);
  v_07.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_07.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_07);
  v_08.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_08.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_08);
  v_09.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_09.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_09);
  v_10.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_10.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_10);
  v_11.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_11.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_11);
  v_12.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_12.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_12);
  local_1b8 = local_2d0;
  local_1c0.float64 = local_2d8.float64;
  return _local_1c0;
LAB_00171b14:
  if (local_370.len <= local_384) goto LAB_00172702;
  JVar1 = local_370.arr[local_384].u;
  iVar2 = local_370.arr[local_384].tag;
  obj.tag = (int64_t)in_stack_fffffffffffff980.ptr;
  obj.u.float64 = in_stack_fffffffffffff978.float64;
  iVar4 = js_get_length32((JSContext *)in_stack_fffffffffffff970.ptr,
                          (uint32_t *)in_stack_fffffffffffff968.ptr,obj);
  if (iVar4 < 0) goto LAB_00172771;
  v_01.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_01.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_01);
  obj_01.tag = (int64_t)in_stack_fffffffffffff9a0.ptr;
  obj_01.u.float64 = in_stack_fffffffffffff998.float64;
  ctx_00 = local_1d8;
  JS_GetPropertyInt64((JSContext *)local_1d8.ptr,obj_01,(int64_t)in_stack_fffffffffffff988);
  val_05.tag = (int64_t)in_stack_fffffffffffff968.ptr;
  val_05.u.ptr = in_stack_fffffffffffff960.ptr;
  JVar7 = JS_ToStringFree((JSContext *)in_stack_fffffffffffff958.ptr,val_05);
  local_4e0 = JVar7.u;
  local_298 = local_4e0;
  local_4d8 = JVar7.tag;
  iStack_290 = local_4d8;
  iVar4 = JS_IsException(JVar7);
  if (iVar4 != 0) goto LAB_00172771;
  local_178.float64 = local_1d8.float64;
  local_17c = 0x57;
  obj_06.tag = (int64_t)in_stack_fffffffffffffac0.ptr;
  obj_06.u.float64 = in_stack_fffffffffffffab8.float64;
  this_obj_09.tag = (int64_t)in_stack_fffffffffffffab0.ptr;
  this_obj_09.u.float64 = in_stack_fffffffffffffaa8.float64;
  in_stack_fffffffffffff988 = local_1d8;
  local_170 = JVar1;
  local_168 = iVar2;
  local_160 = JS_GetPropertyInternal
                        ((JSContext *)in_stack_fffffffffffffaa0.ptr,obj_06,
                         (JSAtom)((ulong)in_stack_fffffffffffffa98 >> 0x20),this_obj_09,
                         in_stack_fffffffffffffb40.int32);
  val_09.tag = (int64_t)in_stack_fffffffffffff970.ptr;
  val_09.u.ptr = in_stack_fffffffffffff968.ptr;
  iVar4 = JS_ToLengthFree((JSContext *)in_stack_fffffffffffff960.ptr,
                          (int64_t *)in_stack_fffffffffffff958.ptr,val_09);
  if (iVar4 != 0) goto LAB_00172771;
  if ((long)(ulong)((uint)*(undefined8 *)((long)local_2e0.ptr + 4) & 0x7fffffff) < (long)local_3a0)
  {
    local_3a0 = (ulong)((uint)*(undefined8 *)((long)local_2e0.ptr + 4) & 0x7fffffff);
  }
  else if ((long)local_3a0 < 0) {
    local_3a0 = 0;
  }
  v_02.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_02.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_02);
  JVar7 = JS_NewArray(in_stack_fffffffffffff950);
  local_510 = JVar7.u;
  local_2a8 = local_510;
  local_508 = JVar7.tag;
  local_2a0 = local_508;
  iVar4 = JS_IsException(JVar7);
  if (iVar4 != 0) goto LAB_00172771;
  v_19.tag = iStack_290;
  v_19.u.float64 = local_298.float64;
  in_stack_fffffffffffff980 = local_1d8;
  JS_DupValue((JSContext *)local_1d8.ptr,v_19);
  this_obj_01.tag = (int64_t)ctx_00.ptr;
  this_obj_01.u.float64 = in_stack_fffffffffffff988.float64;
  val_10.tag = (int64_t)in_stack_fffffffffffff980.ptr;
  val_10.u.float64 = in_stack_fffffffffffff978.float64;
  iVar4 = JS_DefinePropertyValueInt64
                    ((JSContext *)in_stack_fffffffffffff970.ptr,this_obj_01,
                     (int64_t)in_stack_fffffffffffff968,val_10,(int)in_stack_fffffffffffffa00);
  if (iVar4 < 0) goto LAB_00172771;
  for (local_380 = 1; local_380 < local_394; local_380 = local_380 + 1) {
    obj_02.tag = (int64_t)in_stack_fffffffffffff9a0.ptr;
    obj_02.u.float64 = in_stack_fffffffffffff998.float64;
    JVar7 = JS_GetPropertyInt64((JSContext *)ctx_00.ptr,obj_02,(int64_t)in_stack_fffffffffffff988);
    in_stack_fffffffffffffac0 = JVar7.u;
    iVar4 = JS_IsException(JVar7);
    if (iVar4 != 0) goto LAB_00172771;
    iVar4 = JS_IsUndefined(JVar7);
    if (iVar4 == 0) {
      val_06.tag = (int64_t)in_stack_fffffffffffff968.ptr;
      val_06.u.ptr = in_stack_fffffffffffff960.ptr;
      JVar7 = JS_ToStringFree((JSContext *)in_stack_fffffffffffff958.ptr,val_06);
      in_stack_fffffffffffffab0 = JVar7.u;
      in_stack_fffffffffffffab8 = (JSValueUnion)JVar7.tag;
      iVar4 = JS_IsException(JVar7);
      if (iVar4 != 0) goto LAB_00172771;
    }
    this_obj_02.tag = (int64_t)ctx_00.ptr;
    this_obj_02.u.float64 = in_stack_fffffffffffff988.float64;
    val_11.tag = (int64_t)in_stack_fffffffffffff980.ptr;
    val_11.u.float64 = in_stack_fffffffffffff978.float64;
    iVar4 = JS_DefinePropertyValueInt64
                      ((JSContext *)in_stack_fffffffffffff970.ptr,this_obj_02,
                       (int64_t)in_stack_fffffffffffff968,val_11,(int)in_stack_fffffffffffffa00);
    if (iVar4 < 0) goto LAB_00172771;
  }
  v_03.tag = (int64_t)in_stack_fffffffffffff960.ptr;
  v_03.u.ptr = in_stack_fffffffffffff958.ptr;
  JS_FreeValue(in_stack_fffffffffffff950,v_03);
  local_1a8.float64 = local_1d8.float64;
  local_1ac = 0x87;
  to = 0;
  obj_07.tag = (int64_t)in_stack_fffffffffffffac0.ptr;
  obj_07.u.float64 = in_stack_fffffffffffffab8.float64;
  this_obj_10.tag = (int64_t)in_stack_fffffffffffffab0.ptr;
  this_obj_10.u.float64 = in_stack_fffffffffffffaa8.float64;
  local_1a0 = JVar1;
  local_198 = iVar2;
  _local_190 = JS_GetPropertyInternal
                         ((JSContext *)in_stack_fffffffffffffaa0.ptr,obj_07,
                          (JSAtom)((ulong)in_stack_fffffffffffffa98 >> 0x20),this_obj_10,
                          in_stack_fffffffffffffb40.int32);
  local_2c8 = local_190;
  local_2c0 = local_188;
  in_stack_fffffffffffffaa0 = local_190;
  in_stack_fffffffffffffaa8 = local_188;
  iVar4 = JS_IsException(_local_190);
  if (iVar4 != 0) goto LAB_00172771;
  if (iVar3 == 0) {
    v_16.tag = (int64_t)local_2c0.ptr;
    v_16.u.ptr = local_2c8.ptr;
    iVar4 = JS_IsUndefined(v_16);
    if (iVar4 == 0) {
      val_17.tag = (int64_t)in_stack_fffffffffffff9f0.ptr;
      val_17.u.float64 = in_stack_fffffffffffff9e8.float64;
      JVar7 = JS_ToObject((JSContext *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0)
                          ,val_17);
      local_5e0 = JVar7.u;
      local_5d8 = JVar7.tag;
      iVar4 = JS_IsException(JVar7);
      if (iVar4 != 0) goto LAB_00172771;
    }
    else {
      local_5e0.ptr = (void *)((ulong)uStack_5ec << 0x20);
      local_5d8 = 3;
    }
    local_268 = local_298;
    iStack_260 = iStack_290;
    local_258.float64 = local_278.float64;
    iStack_250 = iStack_270;
    local_b8.float64 = local_1d8.float64;
    local_bc = (int)local_3a0;
    local_b0 = (int)local_3a0;
    local_a8 = 0;
    in_stack_fffffffffffffa00 = CONCAT44(uStack_ac,(int)local_3a0);
    local_240 = 0;
    local_238 = local_2a8;
    local_230 = local_2a0;
    local_218 = local_288;
    local_210 = local_280;
    v_05.tag = (int64_t)in_stack_fffffffffffff960.ptr;
    v_05.u.ptr = in_stack_fffffffffffff958.ptr;
    local_248 = in_stack_fffffffffffffa00;
    local_228 = local_5e0;
    local_220 = local_5d8;
    JS_FreeValue(in_stack_fffffffffffff950,v_05);
    in_stack_fffffffffffff9e0 = 0;
    in_stack_fffffffffffff9e8.float64 = 1.48219693752374e-323;
    this_val_02.tag = (int64_t)in_stack_fffffffffffffa80.ptr;
    this_val_02.u.float64 = in_stack_fffffffffffffa78.float64;
    JVar7 = js_string___GetSubstitution
                      ((JSContext *)in_stack_fffffffffffffa70.ptr,this_val_02,
                       (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
                       (JSValue *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    in_stack_fffffffffffff9f0 = JVar7.u;
    local_608 = JVar7.tag;
    local_2b0 = local_608;
    v_06.tag = (int64_t)in_stack_fffffffffffff960.ptr;
    v_06.u.ptr = in_stack_fffffffffffff958.ptr;
    local_2b8 = in_stack_fffffffffffff9f0;
    JS_FreeValue(in_stack_fffffffffffff950,v_06);
  }
  else {
    local_98.float64 = local_1d8.float64;
    local_9c = (int)local_3a0;
    local_90 = (int)local_3a0;
    local_88 = 0;
    in_stack_fffffffffffffa98 = 0;
    this_obj_03.tag = (int64_t)ctx_00.ptr;
    this_obj_03.u.ptr = in_stack_fffffffffffff988.ptr;
    val_12.tag = (int64_t)in_stack_fffffffffffff980.ptr;
    val_12.u.float64 = in_stack_fffffffffffff978.float64;
    iVar4 = JS_DefinePropertyValueInt64
                      ((JSContext *)in_stack_fffffffffffff970.ptr,this_obj_03,
                       (int64_t)in_stack_fffffffffffff968,val_12,(int)in_stack_fffffffffffffa00);
    if (iVar4 < 0) goto LAB_00172771;
    in_stack_fffffffffffff978 = (JSValueUnion)(long)(int)(local_380 + 1);
    v_20.tag = iStack_270;
    v_20.u.float64 = local_278.float64;
    in_stack_fffffffffffff970 = local_1d8;
    JVar7 = JS_DupValue((JSContext *)local_1d8.ptr,v_20);
    in_stack_fffffffffffffa80 = JVar7.u;
    to = 0x4007;
    this_obj_04.tag = (int64_t)ctx_00.ptr;
    this_obj_04.u.ptr = in_stack_fffffffffffff988.ptr;
    val_13.tag = (int64_t)in_stack_fffffffffffff980.ptr;
    val_13.u.float64 = in_stack_fffffffffffff978.float64;
    iVar4 = JS_DefinePropertyValueInt64
                      ((JSContext *)in_stack_fffffffffffff970.ptr,this_obj_04,
                       (int64_t)in_stack_fffffffffffff968,val_13,(int)in_stack_fffffffffffffa00);
    if (iVar4 < 0) goto LAB_00172771;
    v_14.tag = (int64_t)local_2c0.ptr;
    v_14.u.ptr = local_2c8.ptr;
    iVar4 = JS_IsUndefined(v_14);
    if (iVar4 == 0) {
      in_stack_fffffffffffff968 = (JSValueUnion)(long)(int)(local_380 + 2);
      v_15.tag = (int64_t)local_2c0.ptr;
      v_15.u.ptr = local_2c8.ptr;
      in_stack_fffffffffffff960 = local_1d8;
      JVar7 = JS_DupValue((JSContext *)local_1d8.ptr,v_15);
      in_stack_fffffffffffffa70 = JVar7.u;
      in_stack_fffffffffffffa78 = (JSValueUnion)JVar7.tag;
      to = 0x4007;
      this_obj_05.tag = (int64_t)ctx_00.ptr;
      this_obj_05.u.ptr = in_stack_fffffffffffff988.ptr;
      val_14.tag = (int64_t)in_stack_fffffffffffff980.ptr;
      val_14.u.float64 = in_stack_fffffffffffff978.float64;
      iVar4 = JS_DefinePropertyValueInt64
                        ((JSContext *)in_stack_fffffffffffff970.ptr,this_obj_05,
                         (int64_t)in_stack_fffffffffffff968,val_14,(int)in_stack_fffffffffffffa00);
      if (iVar4 < 0) goto LAB_00172771;
    }
    in_stack_fffffffffffffa60 = 0;
    in_stack_fffffffffffffa68 = 0;
    local_268.ptr = (void *)((ulong)in_stack_fffffffffffffa64 << 0x20);
    iStack_260 = 3;
    local_258 = local_2a8;
    iStack_250 = local_2a0;
    v_04.tag = (int64_t)in_stack_fffffffffffff960.ptr;
    v_04.u.float64 = in_stack_fffffffffffff958.float64;
    JS_FreeValue(in_stack_fffffffffffff950,v_04);
    this_val_00.tag = in_stack_fffffffffffff9d0;
    this_val_00.u.float64 = in_stack_fffffffffffff9c8.float64;
    in_stack_fffffffffffff958 = local_1d8;
    js_function_apply((JSContext *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                      this_val_00,JVar8._4_4_,(JSValue *)in_stack_fffffffffffff9b0.ptr,
                      in_stack_fffffffffffff9ac);
    val_07.tag = (int64_t)in_stack_fffffffffffff968.ptr;
    val_07.u.ptr = in_stack_fffffffffffff960.ptr;
    JVar7 = JS_ToStringFree((JSContext *)in_stack_fffffffffffff958.ptr,val_07);
    local_2b8 = JVar7.u;
    local_5a8 = JVar7.tag;
    local_2b0 = local_5a8;
  }
  v_17.tag = local_2b0;
  v_17.u.float64 = local_2b8.float64;
  iVar4 = JS_IsException(v_17);
  if (iVar4 != 0) goto LAB_00172771;
  if ((long)local_37c <= (long)local_3a0) {
    string_buffer_concat
              ((StringBuffer *)in_stack_fffffffffffff958.ptr,(JSString *)in_stack_fffffffffffff950,
               in_stack_fffffffffffff94c,to);
    v_13.tag = (int64_t)in_stack_fffffffffffff988.ptr;
    v_13.u.ptr = in_stack_fffffffffffff980.ptr;
    string_buffer_concat_value((StringBuffer *)in_stack_fffffffffffff978.ptr,v_13);
    local_37c = (int)local_3a0 + ((uint)*(undefined8 *)((long)local_298.ptr + 4) & 0x7fffffff);
  }
  local_384 = local_384 + 1;
  goto LAB_00171b14;
LAB_00172702:
  string_buffer_concat
            ((StringBuffer *)in_stack_fffffffffffff958.ptr,(JSString *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff94c,to);
  JVar7 = string_buffer_end((StringBuffer *)in_stack_fffffffffffff950);
  local_2d8 = JVar7.u;
  local_628 = JVar7.tag;
  local_2d0 = local_628;
  goto LAB_001727af;
}

Assistant:

static JSValue js_regexp_Symbol_replace(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    // [Symbol.replace](str, rep)
    JSValueConst rx = this_val, rep = argv[1];
    JSValueConst args[6];
    JSValue str, rep_val, matched, tab, rep_str, namedCaptures, res;
    JSString *sp, *rp;
    StringBuffer b_s, *b = &b_s;
    ValueBuffer v_b, *results = &v_b;
    int nextSourcePosition, n, j, functionalReplace, is_global, fullUnicode;
    uint32_t nCaptures;
    int64_t position;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    string_buffer_init(ctx, b, 0);
    value_buffer_init(ctx, results);

    rep_val = JS_UNDEFINED;
    matched = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    rep_str = JS_UNDEFINED;
    namedCaptures = JS_UNDEFINED;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
        
    sp = JS_VALUE_GET_STRING(str);
    rp = NULL;
    functionalReplace = JS_IsFunction(ctx, rep);
    if (!functionalReplace) {
        rep_val = JS_ToString(ctx, rep);
        if (JS_IsException(rep_val))
            goto exception;
        rp = JS_VALUE_GET_STRING(rep_val);
    }
    fullUnicode = 0;
    is_global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (is_global < 0)
        goto exception;
    if (is_global) {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
    }

    if (rp && rp->len == 0 && is_global && js_is_standard_regexp(ctx, rx)) {
        /* use faster version for simple cases */
        res = JS_RegExpDelete(ctx, rx, str);
        goto done;
    }
    for(;;) {
        JSValue result;
        result = JS_RegExpExec(ctx, rx, str);
        if (JS_IsException(result))
            goto exception;
        if (JS_IsNull(result))
            break;
        if (value_buffer_append(results, result) < 0)
            goto exception;
        if (!is_global)
            break;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_IsEmptyString(matched)) {
            /* always advance of at least one char */
            int64_t thisIndex, nextIndex;
            if (JS_ToLengthFree(ctx, &thisIndex, JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                goto exception;
            nextIndex = string_advance_index(sp, thisIndex, fullUnicode);
            if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                goto exception;
        }
    }
    nextSourcePosition = 0;
    for(j = 0; j < results->len; j++) {
        JSValueConst result;
        result = results->arr[j];
        if (js_get_length32(ctx, &nCaptures, result) < 0)
            goto exception;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_ToLengthFree(ctx, &position, JS_GetProperty(ctx, result, JS_ATOM_index)))
            goto exception;
        if (position > sp->len)
            position = sp->len;
        else if (position < 0)
            position = 0;
        /* ignore substition if going backward (can happen
           with custom regexp object) */
        JS_FreeValue(ctx, tab);
        tab = JS_NewArray(ctx);
        if (JS_IsException(tab))
            goto exception;
        if (JS_DefinePropertyValueInt64(ctx, tab, 0, JS_DupValue(ctx, matched),
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            goto exception;
        for(n = 1; n < nCaptures; n++) {
            JSValue capN;
            capN = JS_GetPropertyInt64(ctx, result, n);
            if (JS_IsException(capN))
                goto exception;
            if (!JS_IsUndefined(capN)) {
                capN = JS_ToStringFree(ctx, capN);
                if (JS_IsException(capN))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, tab, n, capN,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
        JS_FreeValue(ctx, namedCaptures);
        namedCaptures = JS_GetProperty(ctx, result, JS_ATOM_groups);
        if (JS_IsException(namedCaptures))
            goto exception;
        if (functionalReplace) {
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_NewInt32(ctx, position), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, str), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (!JS_IsUndefined(namedCaptures)) {
                if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, namedCaptures), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
            }
            args[0] = JS_UNDEFINED;
            args[1] = tab;
            JS_FreeValue(ctx, rep_str);
            rep_str = JS_ToStringFree(ctx, js_function_apply(ctx, rep, 2, args, 0));
        } else {
            JSValue namedCaptures1;
            if (!JS_IsUndefined(namedCaptures)) {
                namedCaptures1 = JS_ToObject(ctx, namedCaptures);
                if (JS_IsException(namedCaptures1))
                    goto exception;
            } else {
                namedCaptures1 = JS_UNDEFINED;
            }
            args[0] = matched;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, position);
            args[3] = tab;
            args[4] = namedCaptures1;
            args[5] = rep_val;
            JS_FreeValue(ctx, rep_str);
            rep_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
            JS_FreeValue(ctx, namedCaptures1);
        }
        if (JS_IsException(rep_str))
            goto exception;
        if (position >= nextSourcePosition) {
            string_buffer_concat(b, sp, nextSourcePosition, position);
            string_buffer_concat_value(b, rep_str);
            nextSourcePosition = position + JS_VALUE_GET_STRING(matched)->len;
        }
    }
    string_buffer_concat(b, sp, nextSourcePosition, sp->len);
    res = string_buffer_end(b);
    goto done1;

exception:
    res = JS_EXCEPTION;
done:
    string_buffer_free(b);
done1:
    value_buffer_free(results);
    JS_FreeValue(ctx, rep_val);
    JS_FreeValue(ctx, matched);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, rep_str);
    JS_FreeValue(ctx, namedCaptures);
    JS_FreeValue(ctx, str);
    return res;
}